

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

void __thiscall Node::Node(Node *this,Node *node)

{
  bool bVar1;
  reference __x;
  Node *item;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Node,_std::allocator<Node>_> *__range1;
  Node *node_local;
  Node *this_local;
  
  this->_if = false;
  this->_else = false;
  std::__cxx11::string::string((string *)&this->value);
  std::vector<Node,_std::allocator<Node>_>::vector(&this->subnodes);
  this->kind = node->kind;
  std::__cxx11::string::operator=((string *)&this->value,(string *)&node->value);
  __end1 = std::vector<Node,_std::allocator<Node>_>::begin(&node->subnodes);
  item = (Node *)std::vector<Node,_std::allocator<Node>_>::end(&node->subnodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Node_*,_std::vector<Node,_std::allocator<Node>_>_>
                                *)&item);
    if (!bVar1) break;
    __x = __gnu_cxx::__normal_iterator<const_Node_*,_std::vector<Node,_std::allocator<Node>_>_>::
          operator*(&__end1);
    std::vector<Node,_std::allocator<Node>_>::push_back(&this->subnodes,__x);
    __gnu_cxx::__normal_iterator<const_Node_*,_std::vector<Node,_std::allocator<Node>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

Node::Node(const Node &node) {
    kind = node.kind;
    value = node.value;
    for (auto &item : node.subnodes) {
        subnodes.push_back(item);
    }
}